

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_translate_code(tftp_error_t error)

{
  CURLcode local_10;
  CURLcode result;
  tftp_error_t error_local;
  
  if (error == TFTP_ERR_NONE) {
    local_10 = CURLE_OK;
  }
  else if (error == TFTP_ERR_TIMEOUT) {
    local_10 = CURLE_OPERATION_TIMEDOUT;
  }
  else if (error == TFTP_ERR_NORESPONSE) {
    local_10 = CURLE_COULDNT_CONNECT;
  }
  else {
    if (error != TFTP_ERR_UNDEF) {
      if (error == TFTP_ERR_NOTFOUND) {
        return CURLE_TFTP_NOTFOUND;
      }
      if (error == TFTP_ERR_PERM) {
        return CURLE_TFTP_PERM;
      }
      if (error == TFTP_ERR_DISKFULL) {
        return CURLE_REMOTE_DISK_FULL;
      }
      if (error != TFTP_ERR_ILLEGAL) {
        if (error == TFTP_ERR_UNKNOWNID) {
          return CURLE_TFTP_UNKNOWNID;
        }
        if (error != TFTP_ERR_EXISTS) {
          if (error != TFTP_ERR_NOSUCHUSER) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
          return CURLE_TFTP_NOSUCHUSER;
        }
        return CURLE_REMOTE_FILE_EXISTS;
      }
    }
    local_10 = CURLE_TFTP_ILLEGAL;
  }
  return local_10;
}

Assistant:

static CURLcode tftp_translate_code(tftp_error_t error)
{
  CURLcode result = CURLE_OK;

  if(error != TFTP_ERR_NONE) {
    switch(error) {
    case TFTP_ERR_NOTFOUND:
      result = CURLE_TFTP_NOTFOUND;
      break;
    case TFTP_ERR_PERM:
      result = CURLE_TFTP_PERM;
      break;
    case TFTP_ERR_DISKFULL:
      result = CURLE_REMOTE_DISK_FULL;
      break;
    case TFTP_ERR_UNDEF:
    case TFTP_ERR_ILLEGAL:
      result = CURLE_TFTP_ILLEGAL;
      break;
    case TFTP_ERR_UNKNOWNID:
      result = CURLE_TFTP_UNKNOWNID;
      break;
    case TFTP_ERR_EXISTS:
      result = CURLE_REMOTE_FILE_EXISTS;
      break;
    case TFTP_ERR_NOSUCHUSER:
      result = CURLE_TFTP_NOSUCHUSER;
      break;
    case TFTP_ERR_TIMEOUT:
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    case TFTP_ERR_NORESPONSE:
      result = CURLE_COULDNT_CONNECT;
      break;
    default:
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
  else
    result = CURLE_OK;

  return result;
}